

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ep.c
# Opt level: O2

void nn_ep_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  undefined8 uVar1;
  
  if (type == -3 && (src ^ 0xfffffffeU) == 0) {
    uVar1._0_4_ = self[3].state;
    uVar1._4_4_ = self[3].src;
    (*(code *)self[3].srcptr)(uVar1);
    *(undefined4 *)&self[1].fn = 3;
  }
  else {
    if (*(int *)&self[1].fn != 3) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)*(uint *)&self[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/ep.c"
              ,0x9e);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((src ^ 0xfffffffeU) == 0 && type == 1) {
      *(undefined4 *)&self[1].fn = 1;
      nn_fsm_stopped(self,1);
      return;
    }
  }
  return;
}

Assistant:

static void nn_ep_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_ep *ep;

    ep = nn_cont (self, struct nn_ep, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        ep->ops.stop (ep->tran);
        ep->state = NN_EP_STATE_STOPPING;
        return;
    }
    if (nn_slow (ep->state == NN_EP_STATE_STOPPING)) {
        if (src != NN_FSM_ACTION || type != NN_EP_ACTION_STOPPED)
            return;
        ep->state = NN_EP_STATE_IDLE;
        nn_fsm_stopped (&ep->fsm, NN_EP_STOPPED);
        return;
    }

    nn_fsm_bad_state (ep->state, src, type);
}